

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbbitblb.cpp
# Opt level: O1

void __thiscall icu_63::RBBITableBuilder::removeState(RBBITableBuilder *this,IntPair duplStates)

{
  int iVar1;
  UVector32 *this_00;
  uint uVar2;
  int32_t iVar3;
  int iVar4;
  int iVar5;
  RBBIStateDescriptor *this_01;
  int iVar6;
  int index;
  ulong uVar7;
  int index_00;
  void *pvVar8;
  
  pvVar8 = (void *)((ulong)duplStates >> 0x20);
  index_00 = duplStates.second;
  this_01 = (RBBIStateDescriptor *)UVector::elementAt(this->fDStates,index_00);
  UVector::removeElementAt(this->fDStates,index_00);
  if (this_01 != (RBBIStateDescriptor *)0x0) {
    RBBIStateDescriptor::~RBBIStateDescriptor(this_01);
    UMemory::operator_delete((UMemory *)this_01,pvVar8);
  }
  iVar1 = this->fDStates->count;
  uVar2 = RBBISetBuilder::getNumCharCategories(this->fRB->fSetBuilder);
  if (0 < iVar1) {
    index = 0;
    do {
      pvVar8 = UVector::elementAt(this->fDStates,index);
      iVar5 = duplStates.first;
      if (0 < (int)uVar2) {
        uVar7 = 0;
        do {
          this_00 = *(UVector32 **)((long)pvVar8 + 0x28);
          iVar3 = 0;
          if ((long)uVar7 < (long)this_00->count && 0 < (long)this_00->count) {
            iVar3 = this_00->elements[uVar7];
          }
          iVar6 = iVar3 - (uint)(index_00 < iVar3);
          if (iVar3 == index_00) {
            iVar6 = iVar5;
          }
          UVector32::setElementAt(this_00,iVar6,(int32_t)uVar7);
          uVar7 = uVar7 + 1;
        } while (uVar2 != uVar7);
      }
      iVar6 = *(int *)((long)pvVar8 + 4);
      iVar4 = iVar5;
      if (iVar6 == index_00) {
LAB_0029d1d2:
        *(int *)((long)pvVar8 + 4) = iVar4;
      }
      else if (index_00 < iVar6) {
        iVar4 = iVar6 + -1;
        goto LAB_0029d1d2;
      }
      iVar6 = *(int *)((long)pvVar8 + 8);
      if (iVar6 == index_00) {
LAB_0029d1e7:
        *(int *)((long)pvVar8 + 8) = iVar5;
      }
      else if (index_00 < iVar6) {
        iVar5 = iVar6 + -1;
        goto LAB_0029d1e7;
      }
      index = index + 1;
    } while (index != iVar1);
  }
  return;
}

Assistant:

void RBBITableBuilder::removeState(IntPair duplStates) {
    const int32_t keepState = duplStates.first;
    const int32_t duplState = duplStates.second;
    U_ASSERT(keepState < duplState);
    U_ASSERT(duplState < fDStates->size());

    RBBIStateDescriptor *duplSD = (RBBIStateDescriptor *)fDStates->elementAt(duplState);
    fDStates->removeElementAt(duplState);
    delete duplSD;

    int32_t numStates = fDStates->size();
    int32_t numCols = fRB->fSetBuilder->getNumCharCategories();
    for (int32_t state=0; state<numStates; ++state) {
        RBBIStateDescriptor *sd = (RBBIStateDescriptor *)fDStates->elementAt(state);
        for (int32_t col=0; col<numCols; col++) {
            int32_t existingVal = sd->fDtran->elementAti(col);
            int32_t newVal = existingVal;
            if (existingVal == duplState) {
                newVal = keepState;
            } else if (existingVal > duplState) {
                newVal = existingVal - 1;
            }
            sd->fDtran->setElementAt(newVal, col);
        }
        if (sd->fAccepting == duplState) {
            sd->fAccepting = keepState;
        } else if (sd->fAccepting > duplState) {
            sd->fAccepting--;
        }
        if (sd->fLookAhead == duplState) {
            sd->fLookAhead = keepState;
        } else if (sd->fLookAhead > duplState) {
            sd->fLookAhead--;
        }
    }
}